

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::prepareShaderStage
          (VaryingComponentsTest *this,STAGES stage,Type *vector_type,
          ProgramInterface *program_interface,testCase *test_case,
          VaryingPassthrough *varying_passthrough)

{
  string local_3d8;
  Variable *local_3b8;
  Variable *out;
  descriptor *out_desc;
  Variable *in;
  descriptor *in_desc;
  ShaderInterface *pSStack_390;
  GLuint i;
  ShaderInterface *si;
  GLuint local_380;
  GLuint n_desc;
  GLuint last_out_loc;
  GLuint last_in_loc;
  GLchar *interpolation;
  GLuint first_out_loc;
  GLuint first_in_loc;
  descriptor desc_out [8];
  descriptor desc_in [8];
  GLuint local_60;
  GLchar *local_54;
  GLuint local_4c;
  Type *local_48;
  Type *basic_type;
  VaryingPassthrough *pVStack_38;
  GLuint array_length;
  VaryingPassthrough *varying_passthrough_local;
  testCase *test_case_local;
  ProgramInterface *program_interface_local;
  Type *vector_type_local;
  VaryingComponentsTest *pVStack_10;
  STAGES stage_local;
  VaryingComponentsTest *this_local;
  
  pVStack_38 = varying_passthrough;
  varying_passthrough_local = (VaryingPassthrough *)test_case;
  test_case_local = (testCase *)program_interface;
  program_interface_local = (ProgramInterface *)vector_type;
  vector_type_local._4_4_ = stage;
  pVStack_10 = this;
  basic_type._4_4_ =
       (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase.
                          super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 0x110))();
  join_0x00000010_0x00000000_ =
       Utils::Type::GetType
                 (*(TYPES *)&(program_interface_local->m_structures).
                             super__Vector_base<gl4cts::EnhancedLayouts::Utils::Interface_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Interface_*>_>
                             ._M_impl.super__Vector_impl_data._M_start,1,1);
  local_54 = desc_in[7].m_name;
  local_4c = local_60;
  local_48 = (Type *)&local_54;
  interpolation._4_4_ = 0;
  interpolation._0_4_ = 0;
  _last_out_loc = "";
  n_desc = TestBase::getLastInputLocation
                     ((TestBase *)this,vector_type_local._4_4_,(Type *)program_interface_local,
                      basic_type._4_4_);
  local_380 = 0;
  si._4_4_ = 0;
  pSStack_390 = Utils::ProgramInterface::GetShaderInterface
                          ((ProgramInterface *)test_case_local,vector_type_local._4_4_);
  if ((vector_type_local._4_4_ == FRAGMENT) || (vector_type_local._4_4_ == GEOMETRY)) {
    _last_out_loc = " flat";
  }
  if (vector_type_local._4_4_ != FRAGMENT) {
    local_380 = TestBase::getLastOutputLocation
                          ((TestBase *)this,vector_type_local._4_4_,(Type *)program_interface_local,
                           basic_type._4_4_);
  }
  switch(*(undefined4 *)
          &(varying_passthrough_local->m_fragment).
           super__Vector_base<gl4cts::EnhancedLayouts::Utils::VaryingConnection,_std::allocator<gl4cts::EnhancedLayouts::Utils::VaryingConnection>_>
           ._M_impl.super__Vector_impl_data._M_start) {
  case 0:
    si._4_4_ = 2;
    descriptor::assign((descriptor *)&desc_out[7].m_name,0,"comp_x",0,"first_input_location",4,
                       "gvec4");
    descriptor::assign((descriptor *)&desc_in[0].m_name,0,"comp_x",n_desc,"last_input_location",4,
                       "gvec4");
    descriptor::assign((descriptor *)&first_out_loc,0,"comp_x",0,"first_output_location",4,"gvec4");
    descriptor::assign((descriptor *)&desc_out[0].m_name,0,"comp_x",local_380,"last_output_location"
                       ,4,"gvec4");
    break;
  case 1:
    si._4_4_ = 4;
    descriptor::assign((descriptor *)&desc_out[7].m_name,0,"comp_x",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[0].m_name,0,"comp_x",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[1].m_name,1,"comp_y",0,"first_input_location",3,
                       "gvec3");
    descriptor::assign((descriptor *)&desc_in[2].m_name,1,"comp_y",n_desc,"last_input_location",3,
                       "gvec3");
    descriptor::assign((descriptor *)&first_out_loc,0,"comp_x",0,"first_output_location",1,"scalar")
    ;
    descriptor::assign((descriptor *)&desc_out[0].m_name,0,"comp_x",local_380,"last_output_location"
                       ,1,"scalar");
    descriptor::assign((descriptor *)&desc_out[1].m_name,1,"comp_y",0,"first_output_location",3,
                       "gvec3");
    descriptor::assign((descriptor *)&desc_out[2].m_name,1,"comp_y",local_380,"last_output_location"
                       ,3,"gvec3");
    break;
  case 2:
    si._4_4_ = 4;
    descriptor::assign((descriptor *)&desc_out[7].m_name,0,"comp_x",0,"first_input_location",3,
                       "gvec3");
    descriptor::assign((descriptor *)&desc_in[0].m_name,0,"comp_x",n_desc,"last_input_location",3,
                       "gvec3");
    descriptor::assign((descriptor *)&desc_in[1].m_name,3,"comp_w",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[2].m_name,3,"comp_w",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&first_out_loc,0,"comp_x",0,"first_output_location",3,"gvec3");
    descriptor::assign((descriptor *)&desc_out[0].m_name,0,"comp_x",local_380,"last_output_location"
                       ,3,"gvec3");
    descriptor::assign((descriptor *)&desc_out[1].m_name,3,"comp_w",0,"first_output_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_out[2].m_name,3,"comp_w",local_380,"last_output_location"
                       ,1,"scalar");
    break;
  case 3:
    si._4_4_ = 4;
    descriptor::assign((descriptor *)&desc_out[7].m_name,0,"comp_x",0,"first_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_in[0].m_name,0,"comp_x",n_desc,"last_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_in[1].m_name,2,"comp_z",0,"first_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_in[2].m_name,2,"comp_z",n_desc,"last_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&first_out_loc,0,"comp_x",0,"first_output_location",2,"gvec2");
    descriptor::assign((descriptor *)&desc_out[0].m_name,0,"comp_x",local_380,"last_output_location"
                       ,2,"gvec2");
    descriptor::assign((descriptor *)&desc_out[1].m_name,2,"comp_z",0,"first_output_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_out[2].m_name,2,"comp_z",local_380,"last_output_location"
                       ,2,"gvec2");
    break;
  case 4:
    si._4_4_ = 6;
    descriptor::assign((descriptor *)&desc_out[7].m_name,0,"comp_x",0,"first_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_in[0].m_name,0,"comp_x",n_desc,"last_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_in[1].m_name,2,"comp_z",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[2].m_name,2,"comp_z",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[3].m_name,3,"comp_w",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[4].m_name,3,"comp_w",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&first_out_loc,0,"comp_x",0,"first_output_location",2,"gvec2");
    descriptor::assign((descriptor *)&desc_out[0].m_name,0,"comp_x",local_380,"last_output_location"
                       ,2,"gvec2");
    descriptor::assign((descriptor *)&desc_out[1].m_name,2,"comp_z",0,"first_output_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_out[2].m_name,2,"comp_z",local_380,"last_output_location"
                       ,1,"scalar");
    descriptor::assign((descriptor *)&desc_out[3].m_name,3,"comp_w",0,"first_output_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_out[4].m_name,3,"comp_w",local_380,"last_output_location"
                       ,1,"scalar");
    break;
  case 5:
    si._4_4_ = 6;
    descriptor::assign((descriptor *)&desc_out[7].m_name,0,"comp_x",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[0].m_name,0,"comp_x",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[1].m_name,1,"comp_y",0,"first_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_in[2].m_name,1,"comp_y",n_desc,"last_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_in[3].m_name,3,"comp_w",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[4].m_name,3,"comp_w",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&first_out_loc,0,"comp_x",0,"first_output_location",1,"scalar")
    ;
    descriptor::assign((descriptor *)&desc_out[0].m_name,0,"comp_x",local_380,"last_output_location"
                       ,1,"scalar");
    descriptor::assign((descriptor *)&desc_out[1].m_name,1,"comp_y",0,"first_output_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_out[2].m_name,1,"comp_y",local_380,"last_output_location"
                       ,2,"gvec2");
    descriptor::assign((descriptor *)&desc_out[3].m_name,3,"comp_w",0,"first_output_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_out[4].m_name,3,"comp_w",local_380,"last_output_location"
                       ,1,"scalar");
    break;
  case 6:
    si._4_4_ = 6;
    descriptor::assign((descriptor *)&desc_out[7].m_name,0,"comp_x",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[0].m_name,0,"comp_x",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[1].m_name,1,"comp_y",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[2].m_name,1,"comp_y",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[3].m_name,2,"comp_z",0,"first_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_in[4].m_name,2,"comp_z",n_desc,"last_input_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&first_out_loc,0,"comp_x",0,"first_output_location",1,"scalar")
    ;
    descriptor::assign((descriptor *)&desc_out[0].m_name,0,"comp_x",local_380,"last_output_location"
                       ,1,"scalar");
    descriptor::assign((descriptor *)&desc_out[1].m_name,1,"comp_y",0,"first_output_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_out[2].m_name,1,"comp_y",local_380,"last_output_location"
                       ,1,"scalar");
    descriptor::assign((descriptor *)&desc_out[3].m_name,2,"comp_z",0,"first_output_location",2,
                       "gvec2");
    descriptor::assign((descriptor *)&desc_out[4].m_name,2,"comp_z",local_380,"last_output_location"
                       ,2,"gvec2");
    break;
  case 7:
    si._4_4_ = 8;
    descriptor::assign((descriptor *)&desc_out[7].m_name,0,"comp_x",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[0].m_name,0,"comp_x",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[1].m_name,1,"comp_y",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[2].m_name,1,"comp_y",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[3].m_name,2,"comp_z",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[4].m_name,2,"comp_z",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[5].m_name,3,"comp_w",0,"first_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_in[6].m_name,3,"comp_w",n_desc,"last_input_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&first_out_loc,0,"comp_x",0,"first_output_location",1,"scalar")
    ;
    descriptor::assign((descriptor *)&desc_out[0].m_name,0,"comp_x",local_380,"last_output_location"
                       ,1,"scalar");
    descriptor::assign((descriptor *)&desc_out[1].m_name,1,"comp_y",0,"first_output_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_out[2].m_name,1,"comp_y",local_380,"last_output_location"
                       ,1,"scalar");
    descriptor::assign((descriptor *)&desc_out[3].m_name,2,"comp_z",0,"first_output_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_out[4].m_name,2,"comp_z",local_380,"last_output_location"
                       ,1,"scalar");
    descriptor::assign((descriptor *)&desc_out[5].m_name,3,"comp_w",0,"first_output_location",1,
                       "scalar");
    descriptor::assign((descriptor *)&desc_out[6].m_name,3,"comp_w",local_380,"last_output_location"
                       ,1,"scalar");
  }
  for (in_desc._4_4_ = 0; in_desc._4_4_ < si._4_4_; in_desc._4_4_ = in_desc._4_4_ + 1) {
    in = (Variable *)&desc_out[(ulong)in_desc._4_4_ + 7].m_name;
    out_desc = (descriptor *)
               prepareVarying(this,local_48,(descriptor *)in,_last_out_loc,pSStack_390,
                              vector_type_local._4_4_,VARYING_INPUT);
    if (vector_type_local._4_4_ != FRAGMENT) {
      out = (Variable *)(&first_out_loc + (ulong)in_desc._4_4_ * 0xc);
      local_3b8 = prepareVarying(this,local_48,(descriptor *)out,_last_out_loc,pSStack_390,
                                 vector_type_local._4_4_,VARYING_OUTPUT);
      Utils::VaryingPassthrough::Add
                (pVStack_38,vector_type_local._4_4_,(Variable *)out_desc,local_3b8);
    }
  }
  prepareGlobals_abi_cxx11_(&local_3d8,this,n_desc,local_380);
  std::__cxx11::string::operator=((string *)pSStack_390,(string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3d8);
  return;
}

Assistant:

void VaryingComponentsTest::prepareShaderStage(Utils::Shader::STAGES stage, const Utils::Type& vector_type,
											   Utils::ProgramInterface& program_interface, const testCase& test_case,
											   Utils::VaryingPassthrough& varying_passthrough)
{
	const GLuint			array_length = getArrayLength();
	const Utils::Type&		basic_type = Utils::Type::GetType(vector_type.m_basic_type, 1 /* n_cols */, 1 /* n_rows */);
	descriptor				desc_in[8];
	descriptor				desc_out[8];
	const GLuint			first_in_loc  = 0;
	const GLuint			first_out_loc = 0;
	const GLchar*			interpolation = "";
	const GLuint			last_in_loc   = getLastInputLocation(stage, vector_type, array_length);
	GLuint					last_out_loc  = 0;
	GLuint					n_desc		  = 0;
	Utils::ShaderInterface& si			  = program_interface.GetShaderInterface(stage);

	/* Select interpolation */
	if ((Utils::Shader::FRAGMENT == stage) || (Utils::Shader::GEOMETRY == stage))
	{
		interpolation = " flat";
	}

	if (Utils::Shader::FRAGMENT != stage)
	{
		last_out_loc = getLastOutputLocation(stage, vector_type, array_length);
	}

	switch (test_case.m_layout)
	{
	case GVEC4:
		n_desc = 2;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 4, "gvec4");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 4, "gvec4");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 4, "gvec4");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 4, "gvec4");
		break;
	case SCALAR_GVEC3:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 3, "gvec3");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 3, "gvec3");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 3, "gvec3");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 3, "gvec3");
		break;
	case GVEC3_SCALAR:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 3, "gvec3");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 3, "gvec3");
		desc_in[2].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 3, "gvec3");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 3, "gvec3");
		desc_out[2].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case GVEC2_GVEC2:
		n_desc = 4;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[2].assign(2, "comp_z", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[3].assign(2, "comp_z", last_in_loc, "last_input_location", 2, "gvec2");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[2].assign(2, "comp_z", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[3].assign(2, "comp_z", last_out_loc, "last_output_location", 2, "gvec2");
		break;
	case GVEC2_SCALAR_SCALAR:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[2].assign(2, "comp_z", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(2, "comp_z", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[2].assign(2, "comp_z", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(2, "comp_z", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case SCALAR_GVEC2_SCALAR:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 2, "gvec2");
		desc_in[4].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 2, "gvec2");
		desc_out[4].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	case SCALAR_SCALAR_GVEC2:
		n_desc = 6;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(2, "comp_z", first_in_loc, "first_input_location", 2, "gvec2");
		desc_in[5].assign(2, "comp_z", last_in_loc, "last_input_location", 2, "gvec2");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(2, "comp_z", first_out_loc, "first_output_location", 2, "gvec2");
		desc_out[5].assign(2, "comp_z", last_out_loc, "last_output_location", 2, "gvec2");
		break;
	case SCALAR_SCALAR_SCALAR_SCALAR:
		n_desc = 8;
		desc_in[0].assign(0, "comp_x", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[1].assign(0, "comp_x", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[2].assign(1, "comp_y", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[3].assign(1, "comp_y", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[4].assign(2, "comp_z", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[5].assign(2, "comp_z", last_in_loc, "last_input_location", 1, "scalar");
		desc_in[6].assign(3, "comp_w", first_in_loc, "first_input_location", 1, "scalar");
		desc_in[7].assign(3, "comp_w", last_in_loc, "last_input_location", 1, "scalar");

		desc_out[0].assign(0, "comp_x", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[1].assign(0, "comp_x", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[2].assign(1, "comp_y", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[3].assign(1, "comp_y", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[4].assign(2, "comp_z", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[5].assign(2, "comp_z", last_out_loc, "last_output_location", 1, "scalar");
		desc_out[6].assign(3, "comp_w", first_out_loc, "first_output_location", 1, "scalar");
		desc_out[7].assign(3, "comp_w", last_out_loc, "last_output_location", 1, "scalar");
		break;
	}

	for (GLuint i = 0; i < n_desc; ++i)
	{
		const descriptor& in_desc = desc_in[i];

		Utils::Variable* in =
			prepareVarying(basic_type, in_desc, interpolation, si, stage, Utils::Variable::VARYING_INPUT);

		if (Utils::Shader::FRAGMENT != stage)
		{
			const descriptor& out_desc = desc_out[i];

			Utils::Variable* out =
				prepareVarying(basic_type, out_desc, interpolation, si, stage, Utils::Variable::VARYING_OUTPUT);

			varying_passthrough.Add(stage, in, out);
		}
	}

	si.m_globals = prepareGlobals(last_in_loc, last_out_loc);
}